

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  size_type *psVar1;
  pointer pcVar2;
  pointer pAVar3;
  pointer pPVar4;
  long *plVar5;
  XmlWriter *pXVar6;
  pointer stats;
  pointer pPVar7;
  char *__end;
  undefined1 local_b0 [8];
  string name;
  ScopedElement e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Alloc_hider local_58;
  ScopedElement scoped;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  __str.field_2._8_8_ = this;
  trim((string *)local_b0,&(sectionNode->stats).sectionInfo.name);
  if (rootName->_M_string_length != 0) {
    pcVar2 = (rootName->_M_dataplus)._M_p;
    e.m_writer = (XmlWriter *)&__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&e,pcVar2,pcVar2 + rootName->_M_string_length);
    std::__cxx11::string::append((char *)&e);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&e,(ulong)local_b0);
    pXVar6 = (XmlWriter *)(plVar5 + 2);
    if ((XmlWriter *)*plVar5 == pXVar6) {
      local_40._0_1_ = pXVar6->m_tagIsOpen;
      local_40._1_1_ = pXVar6->m_needsNewline;
      local_40._2_6_ = *(undefined6 *)&pXVar6->field_0x2;
      local_40._8_8_ = plVar5[3];
      scoped.m_writer = (XmlWriter *)&local_40;
    }
    else {
      local_40._0_1_ = pXVar6->m_tagIsOpen;
      local_40._1_1_ = pXVar6->m_needsNewline;
      local_40._2_6_ = *(undefined6 *)&pXVar6->field_0x2;
      scoped.m_writer = (XmlWriter *)*plVar5;
    }
    *plVar5 = (long)pXVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_b0,(string *)&scoped);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)scoped.m_writer != &local_40) {
      operator_delete(scoped.m_writer);
    }
    if (e.m_writer != (XmlWriter *)&__str._M_string_length) {
      operator_delete(e.m_writer);
    }
  }
  if ((((sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_finish) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    scoped.m_writer = (XmlWriter *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"testcase","");
    pXVar6 = (XmlWriter *)(__str.field_2._8_8_ + 200);
    name.field_2._8_8_ = pXVar6;
    XmlWriter::startElement(pXVar6,(string *)&scoped);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)scoped.m_writer != &local_40) {
      operator_delete(scoped.m_writer);
    }
    if (className->_M_string_length == 0) {
      scoped.m_writer = (XmlWriter *)&local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"classname","");
      XmlWriter::writeAttribute(pXVar6,(string *)&scoped,(string *)local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scoped.m_writer != &local_40) {
        operator_delete(scoped.m_writer);
      }
      scoped.m_writer = (XmlWriter *)&local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"name","");
      XmlWriter::writeAttribute<char[5]>(pXVar6,(string *)&scoped,(char (*) [5])"root");
    }
    else {
      scoped.m_writer = (XmlWriter *)&local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"classname","");
      XmlWriter::writeAttribute(pXVar6,(string *)&scoped,className);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scoped.m_writer != &local_40) {
        operator_delete(scoped.m_writer);
      }
      scoped.m_writer = (XmlWriter *)&local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"name","");
      XmlWriter::writeAttribute(pXVar6,(string *)&scoped,(string *)local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)scoped.m_writer != &local_40) {
      operator_delete(scoped.m_writer);
    }
    scoped.m_writer = (XmlWriter *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"time","");
    fpToString<double>((string *)&e,(sectionNode->stats).durationInSeconds,10);
    XmlWriter::writeAttribute(pXVar6,(string *)&scoped,(string *)&e);
    psVar1 = &__str._M_string_length;
    if (e.m_writer != (XmlWriter *)psVar1) {
      operator_delete(e.m_writer);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)scoped.m_writer != &local_40) {
      operator_delete(scoped.m_writer);
    }
    pAVar3 = (sectionNode->assertions).
             super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (stats = (sectionNode->assertions).
                 super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
                 _M_impl.super__Vector_impl_data._M_start; stats != pAVar3; stats = stats + 1) {
      writeAssertion((JunitReporter *)__str.field_2._8_8_,stats);
    }
    if ((sectionNode->stdOut)._M_string_length != 0) {
      scoped.m_writer = (XmlWriter *)&local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"system-out","");
      local_58._M_p = (pointer)pXVar6;
      XmlWriter::startElement(pXVar6,(string *)&scoped);
      trim((string *)&e,&sectionNode->stdOut);
      XmlWriter::writeText((XmlWriter *)local_58._M_p,(string *)&e,false);
      if (e.m_writer != (XmlWriter *)psVar1) {
        operator_delete(e.m_writer);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scoped.m_writer != &local_40) {
        operator_delete(scoped.m_writer);
      }
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      scoped.m_writer = (XmlWriter *)&local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"system-err","");
      local_58._M_p = (pointer)pXVar6;
      XmlWriter::startElement(pXVar6,(string *)&scoped);
      trim((string *)&e,&sectionNode->stdErr);
      XmlWriter::writeText((XmlWriter *)local_58._M_p,(string *)&e,false);
      if (e.m_writer != (XmlWriter *)psVar1) {
        operator_delete(e.m_writer);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scoped.m_writer != &local_40) {
        operator_delete(scoped.m_writer);
      }
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)((long)&name.field_2 + 8));
  }
  pPVar7 = (sectionNode->childSections).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (sectionNode->childSections).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar7 != pPVar4) {
    do {
      if (className->_M_string_length == 0) {
        scoped.m_writer = (XmlWriter *)&local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"","");
        writeSection((JunitReporter *)__str.field_2._8_8_,(string *)local_b0,(string *)&scoped,
                     pPVar7->m_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)scoped.m_writer != &local_40) {
          operator_delete(scoped.m_writer);
        }
      }
      else {
        writeSection((JunitReporter *)__str.field_2._8_8_,className,(string *)local_b0,pPVar7->m_p);
      }
      pPVar7 = pPVar7 + 1;
    } while (pPVar7 != pPVar4);
  }
  if (local_b0 != (undefined1  [8])&name._M_string_length) {
    operator_delete((void *)local_b0);
  }
  return;
}

Assistant:

void writeSection(std::string const& className,
			std::string const& rootName,
			SectionNode const& sectionNode) {
			std::string name = trim(sectionNode.stats.sectionInfo.name);
			if (!rootName.empty())
				name = rootName + "/" + name;

			if (!sectionNode.assertions.empty() ||
				!sectionNode.stdOut.empty() ||
				!sectionNode.stdErr.empty()) {
				XmlWriter::ScopedElement e = xml.scopedElement("testcase");
				if (className.empty()) {
					xml.writeAttribute("classname", name);
					xml.writeAttribute("name", "root");
				}
				else {
					xml.writeAttribute("classname", className);
					xml.writeAttribute("name", name);
				}
				xml.writeAttribute("time", Catch::toString(sectionNode.stats.durationInSeconds));

				writeAssertions(sectionNode);

				if (!sectionNode.stdOut.empty())
					xml.scopedElement("system-out").writeText(trim(sectionNode.stdOut), false);
				if (!sectionNode.stdErr.empty())
					xml.scopedElement("system-err").writeText(trim(sectionNode.stdErr), false);
			}
			for (SectionNode::ChildSections::const_iterator
				it = sectionNode.childSections.begin(),
				itEnd = sectionNode.childSections.end();
				it != itEnd;
				++it)
				if (className.empty())
					writeSection(name, "", **it);
				else
					writeSection(className, name, **it);
		}